

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O3

bool __thiscall mocker::detail::ReassociationImpl::operator()(ReassociationImpl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Hash_node_base *p_Var5;
  ReassociationImpl *in_RSI;
  ReassociationImpl *__k;
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  nodes;
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  local_90;
  undefined1 local_78 [40];
  pointer ppStack_50;
  __node_base local_48;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  findRoots(this);
  p_Var5 = (this->roots)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_90.
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var5[1]._M_nxt;
      local_90.
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var5[2]._M_nxt;
      if (local_90.
          super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((local_90.
                     super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->second).
                   super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&((local_90.
                          super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second).
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&((local_90.
                     super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->second).
                   super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&((local_90.
                          super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second).
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      buildTrees((ReassociationImpl *)local_78,(shared_ptr<mocker::ir::Addr> *)this,
                 SUB81(&local_90,0));
      in_RSI = (ReassociationImpl *)(p_Var5 + 1);
      pmVar3 = std::__detail::
               _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->trees,(key_type *)in_RSI);
      uVar2 = local_78._8_8_;
      uVar1 = local_78._0_8_;
      local_78._0_8_ = (element_type *)0x0;
      local_78._8_8_ = (FunctionModule *)0x0;
      this_00 = (pmVar3->
                super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      (pmVar3->
      super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)uVar1;
      (pmVar3->
      super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((FunctionModule *)local_78._8_8_ != (FunctionModule *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      if (local_90.
          super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_90.
                   super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  p_Var5 = (this->trees)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    local_38 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->doNotRebuild;
    do {
      __k = (ReassociationImpl *)(p_Var5 + 1);
      flatten(&local_90,in_RSI,(shared_ptr<mocker::detail::ReassociationImpl::Node> *)(p_Var5 + 3));
      if ((ulong)(((long)local_90.
                         super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.
                         super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 10
         ) {
        in_RSI = __k;
        std::
        _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_M_emplace<std::shared_ptr<mocker::ir::Reg>const&>(local_38);
      }
      cancel((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
              *)(local_78 + 0x20),in_RSI,&local_90);
      pmVar4 = std::__detail::
               _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->flattenedNodes,(key_type *)__k);
      local_78._16_8_ =
           (pmVar4->
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78._0_8_ =
           (pmVar4->
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_78._8_8_ =
           (pmVar4->
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      (pmVar4->
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._32_8_;
      (pmVar4->
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppStack_50;
      (pmVar4->
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48._M_nxt;
      local_78._32_8_ = (pointer)0x0;
      ppStack_50 = (pointer)0x0;
      local_48._M_nxt = (_Hash_node_base *)0x0;
      std::
      vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::~vector((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                 *)local_78);
      std::
      vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::~vector((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                 *)(local_78 + 0x20));
      std::
      vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::~vector(&local_90);
      p_Var5 = p_Var5->_M_nxt;
      in_RSI = __k;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  p_Var5 = (this->roots)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      rankNodes(this,(shared_ptr<mocker::ir::Reg> *)(p_Var5 + 1));
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
    for (p_Var5 = (this->roots)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      rebuild(this,(shared_ptr<mocker::ir::Reg> *)(p_Var5 + 1));
    }
  }
  removeDeletedInsts(this->func);
  return false;
}

Assistant:

bool detail::ReassociationImpl::operator()() {
  findRoots();
  for (auto &root : roots) {
    trees[root] = buildTrees(root, true);
  }
  for (auto &kv : trees) {
    auto nodes = flatten(kv.second);
    if (nodes.size() < 10)
      doNotRebuild.emplace(kv.first);
    flattenedNodes[kv.first] = cancel(nodes);
  }

  for (auto &root : roots) {
    rankNodes(root);
  }

  for (auto &root : roots) {
    rebuild(root);
  }

  removeDeletedInsts(func);

  return false;
}